

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_OrderObserved_TestShell::~TEST_MockSupport_c_OrderObserved_TestShell
          (TEST_MockSupport_c_OrderObserved_TestShell *this)

{
  TEST_MockSupport_c_OrderObserved_TestShell *this_local;
  
  ~TEST_MockSupport_c_OrderObserved_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockSupport_c, OrderObserved)
{
    mock_c()->strictOrder();

    mock_c()->expectOneCall("foo1");
    mock_c()->expectOneCall("foo2");
    mock_c()->actualCall("foo1");
    mock_c()->actualCall("foo2");

    mock_c()->checkExpectations();
}